

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

i8 wherePathSatisfiesOrderBy
             (WhereInfo *pWInfo,ExprList *pOrderBy,WherePath *pPath,u16 wctrlFlags,u16 nLoop,
             WhereLoop *pLast,Bitmask *pRevMask)

{
  ExprList_item *pEVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  int iCur;
  sqlite3 *psVar5;
  char *zLeft;
  bool bVar6;
  long lVar7;
  int iVar8;
  WhereTerm *pWVar9;
  CollSeq *pCVar10;
  Bitmask BVar11;
  byte bVar12;
  ulong uVar13;
  uint uVar14;
  WhereLoop *pWVar15;
  short sVar16;
  ExprList_item *pEVar17;
  Expr *pEVar18;
  ulong uVar19;
  undefined6 in_register_00000082;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  Index *pIVar25;
  ushort uVar26;
  uint op;
  ulong uVar27;
  ulong uVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  uint local_b8;
  ulong local_a8;
  Walker local_60;
  
  psVar5 = pWInfo->pParse->db;
  if (((int)CONCAT62(in_register_00000082,nLoop) == 0) || ((psVar5->dbOptFlags & 0x80) == 0)) {
    uVar4 = (ushort)pOrderBy->nExpr;
    uVar27 = (ulong)uVar4;
    uVar28 = 0;
    if (uVar4 < 0x40) {
      op = ((wctrlFlags >> 0xb & 1) != 0) + 0x182;
      uVar28 = uVar27;
      if (uVar4 != 0) {
        uVar13 = ~(-1L << ((byte)uVar4 & 0x3f));
        pEVar1 = pOrderBy->a;
        uVar21 = 0;
        local_a8 = 0;
        uVar22 = 0;
        pWVar15 = (WhereLoop *)0x0;
        uVar20 = 0;
LAB_00174681:
        if (uVar20 != 0) {
          uVar21 = uVar21 | pWVar15->maskSelf;
        }
        pWVar15 = pLast;
        if ((nLoop <= uVar20) || (pWVar15 = pPath->aLoop[uVar20], (wctrlFlags >> 0xb & 1) == 0)) {
          if ((pWVar15->wsFlags & 0x400) != 0) {
            if ((pWVar15->u).vtab.isOrdered != '\0') {
              uVar22 = uVar13;
            }
            bVar30 = false;
LAB_00174d45:
            if ((uVar22 != uVar13) && (uVar28 = 0xff, bVar30)) {
              do {
                if ((long)uVar27 < 2) goto LAB_00174d7a;
                uVar27 = uVar27 - 1;
                uVar28 = uVar27;
              } while ((-1L << ((byte)uVar27 & 0x3f) | uVar22) != 0xffffffffffffffff);
            }
            goto LAB_00174d7d;
          }
          (pWVar15->u).btree.nIdxCol = 0;
          iCur = pWInfo->pTabList->a[pWVar15->iTab].iCursor;
          uVar23 = 0;
          do {
            if ((uVar22 >> (uVar23 & 0x3f) & 1) == 0) {
              pEVar18 = pEVar1[uVar23].pExpr;
              while ((pEVar18->flags >> 0xc & 1) != 0) {
                if ((pEVar18->flags >> 0x12 & 1) == 0) {
                  pEVar17 = (ExprList_item *)&pEVar18->pLeft;
                }
                else {
                  pEVar17 = ((pEVar18->x).pList)->a;
                }
                pEVar18 = pEVar17->pExpr;
              }
              if (((pEVar18->op == 0x98) && (pEVar18->iTable == iCur)) &&
                 (pWVar9 = sqlite3WhereFindTerm
                                     (&pWInfo->sWC,iCur,(int)pEVar18->iColumn,~uVar21,op,
                                      (Index *)0x0), pWVar9 != (WhereTerm *)0x0)) {
                if (pWVar9->eOperator == 1) {
                  if ((ulong)pWVar15->nLTerm != 0) {
                    uVar19 = 0;
                    do {
                      if (pWVar9 == pWVar15->aLTerm[uVar19]) goto LAB_001747b7;
                      uVar19 = uVar19 + 1;
                    } while (pWVar15->nLTerm != uVar19);
                  }
                }
                else {
LAB_001747b7:
                  if (((pWVar9->eOperator & 0x82) != 0) && (-1 < pEVar18->iColumn)) {
                    pCVar10 = sqlite3ExprCollSeq(pWInfo->pParse,pEVar1[uVar23].pExpr);
                    if (pCVar10 == (CollSeq *)0x0) {
                      pCVar10 = psVar5->pDfltColl;
                    }
                    zLeft = pCVar10->zName;
                    pCVar10 = sqlite3ExprCollSeq(pWInfo->pParse,pWVar9->pExpr);
                    if (pCVar10 == (CollSeq *)0x0) {
                      pCVar10 = psVar5->pDfltColl;
                    }
                    iVar8 = sqlite3StrICmp(zLeft,pCVar10->zName);
                    if (iVar8 != 0) goto LAB_00174838;
                  }
                  uVar22 = uVar22 | 1L << ((byte)uVar23 & 0x3f);
                }
              }
            }
LAB_00174838:
            uVar23 = uVar23 + 1;
          } while (uVar23 != uVar27);
          if ((pWVar15->wsFlags >> 0xc & 1) == 0) {
            if ((pWVar15->wsFlags >> 8 & 1) != 0) {
              uVar23 = 1;
              local_b8 = 0;
              bVar30 = true;
              pIVar25 = (Index *)0x0;
LAB_001748bd:
              uVar19 = 0;
              bVar29 = false;
              bVar12 = 0;
              bVar6 = false;
LAB_001748f1:
              uVar4 = (pWVar15->u).btree.nEq;
              bVar31 = true;
              uVar26 = 1;
              if ((uVar4 <= uVar19) || (uVar26 = 1, uVar19 < pWVar15->nSkip)) {
LAB_00174965:
                if (pIVar25 == (Index *)0x0) {
                  uVar14 = 0xffffffff;
                  bVar32 = false;
                  bVar2 = 0;
                }
                else {
                  sVar16 = pIVar25->aiColumn[uVar19];
                  bVar2 = pIVar25->aSortOrder[uVar19];
                  if (sVar16 == pIVar25->pTable->iPKey) {
                    sVar16 = -1;
                  }
                  uVar14 = (uint)sVar16;
                  bVar32 = -1 < sVar16;
                  if ((((bVar30) && (-1 < sVar16)) && (bVar32 = true, uVar4 <= uVar19)) &&
                     (pIVar25->pTable->aCol[uVar14].notNull == '\0')) {
                    bVar30 = false;
                  }
                }
                if (bVar31) {
                  uVar24 = 0;
                  do {
                    if ((uVar22 >> (uVar24 & 0x3f) & 1) == 0) {
                      pEVar18 = pEVar1[uVar24].pExpr;
                      while (pEVar18 != (Expr *)0x0) {
                        if ((pEVar18->flags >> 0xc & 1) == 0) goto LAB_00174a5d;
                        if ((pEVar18->flags >> 0x12 & 1) == 0) {
                          pEVar17 = (ExprList_item *)&pEVar18->pLeft;
                        }
                        else {
                          pEVar17 = ((pEVar18->x).pList)->a;
                        }
                        pEVar18 = pEVar17->pExpr;
                      }
                      pEVar18 = (Expr *)0x0;
LAB_00174a5d:
                      if ((wctrlFlags & 0xc0) == 0) {
                        uVar26 = wctrlFlags & 0xc0;
                      }
                      if ((int)uVar14 < -1) {
                        iVar8 = sqlite3ExprCompare((Parse *)0x0,pEVar18,
                                                   pIVar25->aColExpr->a[uVar19].pExpr,iCur);
                        if (iVar8 == 0) goto LAB_00174abe;
                      }
                      else if (((pEVar18->op == 0x98) && (pEVar18->iTable == iCur)) &&
                              (uVar14 == (int)pEVar18->iColumn)) {
LAB_00174abe:
                        if (!bVar32) goto LAB_00174b17;
                        pCVar10 = sqlite3ExprCollSeq(pWInfo->pParse,pEVar1[uVar24].pExpr);
                        if (pCVar10 == (CollSeq *)0x0) {
                          pCVar10 = psVar5->pDfltColl;
                        }
                        iVar8 = sqlite3StrICmp(pCVar10->zName,pIVar25->azColl[uVar19]);
                        if (iVar8 == 0) goto LAB_00174b17;
                      }
                    }
                    if (((char)uVar26 == '\0') || (uVar24 = uVar24 + 1, uVar27 <= uVar24)) break;
                  } while( true );
                }
                goto LAB_00174be3;
              }
              pWVar9 = pWVar15->aLTerm[uVar19];
              uVar26 = pWVar9->eOperator;
              if ((op & uVar26) == 0) {
                bVar31 = true;
                if ((uVar26 & 1) == 0) {
LAB_0017493f:
                  uVar26 = 1;
                }
                else {
                  uVar24 = uVar19;
                  do {
                    bVar31 = uVar4 - 1 == uVar24;
                    if (bVar31) goto LAB_0017493f;
                    lVar7 = uVar24 + 1;
                    uVar24 = uVar24 + 1;
                    uVar26 = 0;
                  } while (pWVar15->aLTerm[lVar7]->pExpr != pWVar9->pExpr);
                }
                goto LAB_00174965;
              }
              if ((uVar26 >> 8 & 1) != 0) {
                bVar30 = false;
              }
              goto LAB_00174b93;
            }
            pIVar25 = (pWVar15->u).btree.pIndex;
            if ((pIVar25 == (Index *)0x0) || ((pIVar25->field_0x63 & 4) != 0)) goto LAB_00174d7a;
            uVar23 = (ulong)pIVar25->nColumn;
            bVar30 = pIVar25->onError != '\0';
            if (uVar23 != 0) {
              local_b8 = (uint)pIVar25->nKeyCol;
              goto LAB_001748bd;
            }
            bVar6 = false;
LAB_00174c0b:
            if (!bVar6 && !bVar30) {
              bVar30 = true;
              goto LAB_00174d45;
            }
          }
          local_a8 = local_a8 | pWVar15->maskSelf;
          uVar23 = 0;
          pEVar17 = pEVar1;
          do {
            uVar19 = 1L << ((byte)uVar23 & 0x3f);
            if ((uVar22 >> (uVar23 & 0x3f) & 1) == 0) {
              pEVar18 = pEVar17->pExpr;
              BVar11 = sqlite3WhereExprUsage(&pWInfo->sMaskSet,pEVar18);
              if (BVar11 == 0) {
                local_60.eCode = '\x01';
                local_60.xExprCallback = exprNodeIsConstant;
                local_60.xSelectCallback = selectNodeIsConstant;
                local_60.u.n = 0;
                if ((pEVar18 != (Expr *)0x0) &&
                   (walkExpr(&local_60,pEVar18), local_60.eCode == '\0')) goto LAB_00174c7a;
              }
              if ((~local_a8 & BVar11) != 0) {
                uVar19 = 0;
              }
              uVar22 = uVar22 | uVar19;
            }
LAB_00174c7a:
            uVar23 = uVar23 + 1;
            pEVar17 = pEVar17 + 1;
          } while (uVar27 != uVar23);
        }
        bVar30 = false;
        if ((uVar13 <= uVar22) || (bVar29 = nLoop <= uVar20, uVar20 = uVar20 + 1, bVar29))
        goto LAB_00174d45;
        goto LAB_00174681;
      }
    }
  }
  else {
LAB_00174d7a:
    uVar28 = 0;
  }
LAB_00174d7d:
  return (i8)uVar28;
LAB_00174b17:
  (pWVar15->u).btree.nIdxCol = (short)uVar19 + 1;
  if ((wctrlFlags & 0x40) == 0) {
    if (bVar29) {
      bVar29 = true;
      if ((bVar2 ^ bVar12) != pOrderBy->a[uVar24 & 0xffffffff].sortOrder) {
LAB_00174be3:
        if ((uint)uVar19 < local_b8) {
          bVar30 = false;
        }
        if (uVar19 == 0) {
          bVar30 = false;
        }
        goto LAB_00174c0b;
      }
    }
    else {
      bVar3 = pOrderBy->a[uVar24 & 0xffffffff].sortOrder;
      bVar12 = bVar3 ^ bVar2;
      bVar29 = true;
      if (bVar3 != bVar2) {
        *pRevMask = *pRevMask | 1L << ((byte)uVar20 & 0x3f);
      }
    }
  }
  if (uVar14 == 0xffffffff) {
    bVar6 = true;
  }
  uVar22 = uVar22 | 1L << (uVar24 & 0x3f);
LAB_00174b93:
  uVar19 = uVar19 + 1;
  if (uVar19 == uVar23) goto LAB_00174c0b;
  goto LAB_001748f1;
}

Assistant:

static i8 wherePathSatisfiesOrderBy(
  WhereInfo *pWInfo,    /* The WHERE clause */
  ExprList *pOrderBy,   /* ORDER BY or GROUP BY or DISTINCT clause to check */
  WherePath *pPath,     /* The WherePath to check */
  u16 wctrlFlags,       /* WHERE_GROUPBY or _DISTINCTBY or _ORDERBY_LIMIT */
  u16 nLoop,            /* Number of entries in pPath->aLoop[] */
  WhereLoop *pLast,     /* Add this WhereLoop to the end of pPath->aLoop[] */
  Bitmask *pRevMask     /* OUT: Mask of WhereLoops to run in reverse order */
){
  u8 revSet;            /* True if rev is known */
  u8 rev;               /* Composite sort order */
  u8 revIdx;            /* Index sort order */
  u8 isOrderDistinct;   /* All prior WhereLoops are order-distinct */
  u8 distinctColumns;   /* True if the loop has UNIQUE NOT NULL columns */
  u8 isMatch;           /* iColumn matches a term of the ORDER BY clause */
  u16 eqOpMask;         /* Allowed equality operators */
  u16 nKeyCol;          /* Number of key columns in pIndex */
  u16 nColumn;          /* Total number of ordered columns in the index */
  u16 nOrderBy;         /* Number terms in the ORDER BY clause */
  int iLoop;            /* Index of WhereLoop in pPath being processed */
  int i, j;             /* Loop counters */
  int iCur;             /* Cursor number for current WhereLoop */
  int iColumn;          /* A column number within table iCur */
  WhereLoop *pLoop = 0; /* Current WhereLoop being processed. */
  WhereTerm *pTerm;     /* A single term of the WHERE clause */
  Expr *pOBExpr;        /* An expression from the ORDER BY clause */
  CollSeq *pColl;       /* COLLATE function from an ORDER BY clause term */
  Index *pIndex;        /* The index associated with pLoop */
  sqlite3 *db = pWInfo->pParse->db;  /* Database connection */
  Bitmask obSat = 0;    /* Mask of ORDER BY terms satisfied so far */
  Bitmask obDone;       /* Mask of all ORDER BY terms */
  Bitmask orderDistinctMask;  /* Mask of all well-ordered loops */
  Bitmask ready;              /* Mask of inner loops */

  /*
  ** We say the WhereLoop is "one-row" if it generates no more than one
  ** row of output.  A WhereLoop is one-row if all of the following are true:
  **  (a) All index columns match with WHERE_COLUMN_EQ.
  **  (b) The index is unique
  ** Any WhereLoop with an WHERE_COLUMN_EQ constraint on the rowid is one-row.
  ** Every one-row WhereLoop will have the WHERE_ONEROW bit set in wsFlags.
  **
  ** We say the WhereLoop is "order-distinct" if the set of columns from
  ** that WhereLoop that are in the ORDER BY clause are different for every
  ** row of the WhereLoop.  Every one-row WhereLoop is automatically
  ** order-distinct.   A WhereLoop that has no columns in the ORDER BY clause
  ** is not order-distinct. To be order-distinct is not quite the same as being
  ** UNIQUE since a UNIQUE column or index can have multiple rows that 
  ** are NULL and NULL values are equivalent for the purpose of order-distinct.
  ** To be order-distinct, the columns must be UNIQUE and NOT NULL.
  **
  ** The rowid for a table is always UNIQUE and NOT NULL so whenever the
  ** rowid appears in the ORDER BY clause, the corresponding WhereLoop is
  ** automatically order-distinct.
  */

  assert( pOrderBy!=0 );
  if( nLoop && OptimizationDisabled(db, SQLITE_OrderByIdxJoin) ) return 0;

  nOrderBy = pOrderBy->nExpr;
  testcase( nOrderBy==BMS-1 );
  if( nOrderBy>BMS-1 ) return 0;  /* Cannot optimize overly large ORDER BYs */
  isOrderDistinct = 1;
  obDone = MASKBIT(nOrderBy)-1;
  orderDistinctMask = 0;
  ready = 0;
  eqOpMask = WO_EQ | WO_IS | WO_ISNULL;
  if( wctrlFlags & WHERE_ORDERBY_LIMIT ) eqOpMask |= WO_IN;
  for(iLoop=0; isOrderDistinct && obSat<obDone && iLoop<=nLoop; iLoop++){
    if( iLoop>0 ) ready |= pLoop->maskSelf;
    if( iLoop<nLoop ){
      pLoop = pPath->aLoop[iLoop];
      if( wctrlFlags & WHERE_ORDERBY_LIMIT ) continue;
    }else{
      pLoop = pLast;
    }
    if( pLoop->wsFlags & WHERE_VIRTUALTABLE ){
      if( pLoop->u.vtab.isOrdered ) obSat = obDone;
      break;
    }else{
      pLoop->u.btree.nIdxCol = 0;
    }
    iCur = pWInfo->pTabList->a[pLoop->iTab].iCursor;

    /* Mark off any ORDER BY term X that is a column in the table of
    ** the current loop for which there is term in the WHERE
    ** clause of the form X IS NULL or X=? that reference only outer
    ** loops.
    */
    for(i=0; i<nOrderBy; i++){
      if( MASKBIT(i) & obSat ) continue;
      pOBExpr = sqlite3ExprSkipCollate(pOrderBy->a[i].pExpr);
      if( pOBExpr->op!=TK_COLUMN ) continue;
      if( pOBExpr->iTable!=iCur ) continue;
      pTerm = sqlite3WhereFindTerm(&pWInfo->sWC, iCur, pOBExpr->iColumn,
                       ~ready, eqOpMask, 0);
      if( pTerm==0 ) continue;
      if( pTerm->eOperator==WO_IN ){
        /* IN terms are only valid for sorting in the ORDER BY LIMIT 
        ** optimization, and then only if they are actually used
        ** by the query plan */
        assert( wctrlFlags & WHERE_ORDERBY_LIMIT );
        for(j=0; j<pLoop->nLTerm && pTerm!=pLoop->aLTerm[j]; j++){}
        if( j>=pLoop->nLTerm ) continue;
      }
      if( (pTerm->eOperator&(WO_EQ|WO_IS))!=0 && pOBExpr->iColumn>=0 ){
        const char *z1, *z2;
        pColl = sqlite3ExprCollSeq(pWInfo->pParse, pOrderBy->a[i].pExpr);
        if( !pColl ) pColl = db->pDfltColl;
        z1 = pColl->zName;
        pColl = sqlite3ExprCollSeq(pWInfo->pParse, pTerm->pExpr);
        if( !pColl ) pColl = db->pDfltColl;
        z2 = pColl->zName;
        if( sqlite3StrICmp(z1, z2)!=0 ) continue;
        testcase( pTerm->pExpr->op==TK_IS );
      }
      obSat |= MASKBIT(i);
    }

    if( (pLoop->wsFlags & WHERE_ONEROW)==0 ){
      if( pLoop->wsFlags & WHERE_IPK ){
        pIndex = 0;
        nKeyCol = 0;
        nColumn = 1;
      }else if( (pIndex = pLoop->u.btree.pIndex)==0 || pIndex->bUnordered ){
        return 0;
      }else{
        nKeyCol = pIndex->nKeyCol;
        nColumn = pIndex->nColumn;
        assert( nColumn==nKeyCol+1 || !HasRowid(pIndex->pTable) );
        assert( pIndex->aiColumn[nColumn-1]==XN_ROWID
                          || !HasRowid(pIndex->pTable));
        isOrderDistinct = IsUniqueIndex(pIndex);
      }

      /* Loop through all columns of the index and deal with the ones
      ** that are not constrained by == or IN.
      */
      rev = revSet = 0;
      distinctColumns = 0;
      for(j=0; j<nColumn; j++){
        u8 bOnce = 1; /* True to run the ORDER BY search loop */

        assert( j>=pLoop->u.btree.nEq 
            || (pLoop->aLTerm[j]==0)==(j<pLoop->nSkip)
        );
        if( j<pLoop->u.btree.nEq && j>=pLoop->nSkip ){
          u16 eOp = pLoop->aLTerm[j]->eOperator;

          /* Skip over == and IS and ISNULL terms.  (Also skip IN terms when
          ** doing WHERE_ORDERBY_LIMIT processing). 
          **
          ** If the current term is a column of an ((?,?) IN (SELECT...)) 
          ** expression for which the SELECT returns more than one column,
          ** check that it is the only column used by this loop. Otherwise,
          ** if it is one of two or more, none of the columns can be
          ** considered to match an ORDER BY term.  */
          if( (eOp & eqOpMask)!=0 ){
            if( eOp & WO_ISNULL ){
              testcase( isOrderDistinct );
              isOrderDistinct = 0;
            }
            continue;  
          }else if( ALWAYS(eOp & WO_IN) ){
            /* ALWAYS() justification: eOp is an equality operator due to the
            ** j<pLoop->u.btree.nEq constraint above.  Any equality other
            ** than WO_IN is captured by the previous "if".  So this one
            ** always has to be WO_IN. */
            Expr *pX = pLoop->aLTerm[j]->pExpr;
            for(i=j+1; i<pLoop->u.btree.nEq; i++){
              if( pLoop->aLTerm[i]->pExpr==pX ){
                assert( (pLoop->aLTerm[i]->eOperator & WO_IN) );
                bOnce = 0;
                break;
              }
            }
          }
        }

        /* Get the column number in the table (iColumn) and sort order
        ** (revIdx) for the j-th column of the index.
        */
        if( pIndex ){
          iColumn = pIndex->aiColumn[j];
          revIdx = pIndex->aSortOrder[j];
          if( iColumn==pIndex->pTable->iPKey ) iColumn = -1;
        }else{
          iColumn = XN_ROWID;
          revIdx = 0;
        }

        /* An unconstrained column that might be NULL means that this
        ** WhereLoop is not well-ordered
        */
        if( isOrderDistinct
         && iColumn>=0
         && j>=pLoop->u.btree.nEq
         && pIndex->pTable->aCol[iColumn].notNull==0
        ){
          isOrderDistinct = 0;
        }

        /* Find the ORDER BY term that corresponds to the j-th column
        ** of the index and mark that ORDER BY term off 
        */
        isMatch = 0;
        for(i=0; bOnce && i<nOrderBy; i++){
          if( MASKBIT(i) & obSat ) continue;
          pOBExpr = sqlite3ExprSkipCollate(pOrderBy->a[i].pExpr);
          testcase( wctrlFlags & WHERE_GROUPBY );
          testcase( wctrlFlags & WHERE_DISTINCTBY );
          if( (wctrlFlags & (WHERE_GROUPBY|WHERE_DISTINCTBY))==0 ) bOnce = 0;
          if( iColumn>=(-1) ){
            if( pOBExpr->op!=TK_COLUMN ) continue;
            if( pOBExpr->iTable!=iCur ) continue;
            if( pOBExpr->iColumn!=iColumn ) continue;
          }else{
            if( sqlite3ExprCompare(0,
                  pOBExpr,pIndex->aColExpr->a[j].pExpr,iCur) ){
              continue;
            }
          }
          if( iColumn>=0 ){
            pColl = sqlite3ExprCollSeq(pWInfo->pParse, pOrderBy->a[i].pExpr);
            if( !pColl ) pColl = db->pDfltColl;
            if( sqlite3StrICmp(pColl->zName, pIndex->azColl[j])!=0 ) continue;
          }
          pLoop->u.btree.nIdxCol = j+1;
          isMatch = 1;
          break;
        }
        if( isMatch && (wctrlFlags & WHERE_GROUPBY)==0 ){
          /* Make sure the sort order is compatible in an ORDER BY clause.
          ** Sort order is irrelevant for a GROUP BY clause. */
          if( revSet ){
            if( (rev ^ revIdx)!=pOrderBy->a[i].sortOrder ) isMatch = 0;
          }else{
            rev = revIdx ^ pOrderBy->a[i].sortOrder;
            if( rev ) *pRevMask |= MASKBIT(iLoop);
            revSet = 1;
          }
        }
        if( isMatch ){
          if( iColumn==XN_ROWID ){
            testcase( distinctColumns==0 );
            distinctColumns = 1;
          }
          obSat |= MASKBIT(i);
        }else{
          /* No match found */
          if( j==0 || j<nKeyCol ){
            testcase( isOrderDistinct!=0 );
            isOrderDistinct = 0;
          }
          break;
        }
      } /* end Loop over all index columns */
      if( distinctColumns ){
        testcase( isOrderDistinct==0 );
        isOrderDistinct = 1;
      }
    } /* end-if not one-row */

    /* Mark off any other ORDER BY terms that reference pLoop */
    if( isOrderDistinct ){
      orderDistinctMask |= pLoop->maskSelf;
      for(i=0; i<nOrderBy; i++){
        Expr *p;
        Bitmask mTerm;
        if( MASKBIT(i) & obSat ) continue;
        p = pOrderBy->a[i].pExpr;
        mTerm = sqlite3WhereExprUsage(&pWInfo->sMaskSet,p);
        if( mTerm==0 && !sqlite3ExprIsConstant(p) ) continue;
        if( (mTerm&~orderDistinctMask)==0 ){
          obSat |= MASKBIT(i);
        }
      }
    }
  } /* End the loop over all WhereLoops from outer-most down to inner-most */
  if( obSat==obDone ) return (i8)nOrderBy;
  if( !isOrderDistinct ){
    for(i=nOrderBy-1; i>0; i--){
      Bitmask m = MASKBIT(i) - 1;
      if( (obSat&m)==m ) return i;
    }
    return 0;
  }
  return -1;
}